

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::it_failed(info *this,string *desc,assertion_exception *ex)

{
  failure_formatter_t *pfVar1;
  ostream *poVar2;
  reference pvVar3;
  string local_278 [32];
  string local_258 [32];
  string local_238;
  value_type local_218;
  string local_1f8 [48];
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  assertion_exception *local_20;
  assertion_exception *ex_local;
  string *desc_local;
  info *this_local;
  
  (this->super_colored_base).super_progress_base.specs_failed_ =
       (this->super_colored_base).super_progress_base.specs_failed_ + 1;
  local_20 = ex;
  ex_local = (assertion_exception *)desc;
  desc_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  progress_base::current_context_name_abi_cxx11_(&local_1c8,(progress_base *)this);
  poVar2 = std::operator<<(local_198,(string *)&local_1c8);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)ex_local);
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pfVar1 = (this->super_colored_base).super_progress_base.failure_formatter_;
  (*pfVar1->_vptr_interface[2])(local_1f8,pfVar1,local_20);
  std::operator<<(poVar2,local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringstream::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_colored_base).super_progress_base.failures_,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  pvVar3 = std::
           stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
           ::top(&this->context_stack_);
  pvVar3->total = pvVar3->total + 1;
  pvVar3 = std::
           stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
           ::top(&this->context_stack_);
  pvVar3->failed = pvVar3->failed + 1;
  this->indentation_ = this->indentation_ + -1;
  poVar2 = std::operator<<((this->super_colored_base).stm_,"\r");
  indent_abi_cxx11_(&local_238,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_238);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(local_258);
  poVar2 = std::operator<<(poVar2,local_258);
  poVar2 = std::operator<<(poVar2,"[ FAIL ]");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_278);
  poVar2 = std::operator<<(poVar2,local_278);
  poVar2 = std::operator<<(poVar2," it ");
  poVar2 = std::operator<<(poVar2,(string *)ex_local);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string((string *)&local_238);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void it_failed(const std::string& desc, const detail::assertion_exception& ex) override {
        ++specs_failed_;

        std::stringstream ss;
        ss << current_context_name() << " " << desc << ":" << std::endl
           << failure_formatter_.format(ex);
        failures_.push_back(ss.str());

        ++context_stack_.top().total;
        ++context_stack_.top().failed;
        --indentation_;
        stm_
            << "\r" << indent()
            << colorizer_.bad()
            << "[ FAIL ]"
            << colorizer_.reset()
            << " it " << desc
            << std::endl;
        stm_.flush();
      }